

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateExtkeyFromParentPathRequest,cfd::js::api::json::CreateExtkeyResponse,cfd::js::api::CreateExtkeyFromParentPathRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentPathRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_5c8;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_510 [4];
  JsonClassBase<cfd::js::api::json::CreateExtkeyResponse> local_4f0 [4];
  undefined1 local_4d0 [8];
  CreateExtkeyResponse res_2;
  undefined1 local_470 [8];
  CreateExtkeyResponseStruct response;
  CreateExtkeyFromParentPathRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_f8 [8];
  CreateExtkeyFromParentPathRequest req;
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentPathRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._208_8_ = call_function;
  CreateExtkeyFromParentPathRequest::CreateExtkeyFromParentPathRequest
            ((CreateExtkeyFromParentPathRequest *)local_f8);
  core::JsonClassBase<cfd::js::api::json::CreateExtkeyFromParentPathRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::CreateExtkeyFromParentPathRequest> *)local_f8,
             request_message);
  CreateExtkeyFromParentPathRequest::ConvertToStruct
            ((CreateExtkeyFromParentPathRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (CreateExtkeyFromParentPathRequest *)local_f8);
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentPathRequestStruct_&)>
  ::operator()((CreateExtkeyResponseStruct *)local_470,call_function,
               (CreateExtkeyFromParentPathRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    CreateExtkeyResponse::CreateExtkeyResponse((CreateExtkeyResponse *)local_4d0);
    CreateExtkeyResponse::ConvertFromStruct
              ((CreateExtkeyResponse *)local_4d0,(CreateExtkeyResponseStruct *)local_470);
    core::JsonClassBase<cfd::js::api::json::CreateExtkeyResponse>::Serialize_abi_cxx11_(local_4f0);
    std::__cxx11::string::operator=((string *)this,(string *)local_4f0);
    std::__cxx11::string::~string((string *)local_4f0);
    CreateExtkeyResponse::~CreateExtkeyResponse((CreateExtkeyResponse *)local_4d0);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_5c8,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_510);
    std::__cxx11::string::operator=((string *)this,(string *)local_510);
    std::__cxx11::string::~string((string *)local_510);
    ErrorResponse::~ErrorResponse(&local_5c8);
  }
  res_2._87_1_ = 1;
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct((CreateExtkeyResponseStruct *)local_470);
  CreateExtkeyFromParentPathRequestStruct::~CreateExtkeyFromParentPathRequestStruct
            ((CreateExtkeyFromParentPathRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CreateExtkeyFromParentPathRequest::~CreateExtkeyFromParentPathRequest
            ((CreateExtkeyFromParentPathRequest *)local_f8);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}